

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++_test.cpp
# Opt level: O3

void __thiscall
jsonnet::JsonnetTest_TestEvaluateSnippet_Test::~JsonnetTest_TestEvaluateSnippet_Test
          (JsonnetTest_TestEvaluateSnippet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonnetTest, TestEvaluateSnippet)
{
    const std::string input = readFile("cpp/testdata/example.jsonnet");
    const std::string expected = readFile("cpp/testdata/example_golden.json");

    Jsonnet jsonnet;
    ASSERT_TRUE(jsonnet.init());
    std::string output;
    EXPECT_TRUE(jsonnet.evaluateSnippet("snippet", input, &output));
    EXPECT_EQ(expected, output);
    EXPECT_EQ("", jsonnet.lastError());
}